

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ANMS.cpp
# Opt level: O2

void ANMS(Mat *cNorm,vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *corners,int threshold)

{
  float fVar1;
  int j;
  long lVar2;
  int i;
  long lVar3;
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> keyPoint;
  KeyPoint local_64;
  _Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> local_48;
  
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (lVar3 = 0; lVar3 < *(int *)(cNorm + 8); lVar3 = lVar3 + 1) {
    for (lVar2 = 0; lVar2 < *(int *)(cNorm + 0xc); lVar2 = lVar2 + 1) {
      fVar1 = *(float *)(**(long **)(cNorm + 0x48) * lVar3 + *(long *)(cNorm + 0x10) + lVar2 * 4);
      if ((float)threshold < fVar1) {
        local_64.pt.x = (float)(int)lVar2;
        local_64.size = 3.0;
        local_64.angle = -1.0;
        local_64.octave = 0;
        local_64.class_id = -1;
        local_64.pt.y = (float)(int)lVar3;
        local_64.response = fVar1;
        std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::emplace_back<cv::KeyPoint>
                  ((vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)&local_48,&local_64);
      }
    }
  }
  ANMS((vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)&local_48,corners);
  std::_Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void ANMS(const cv::Mat& cNorm, std::vector<KeyPoint>& corners, int threshold) {

	vector<KeyPoint> keyPoint;

	for (int i = 0; i < cNorm.rows; ++i) {
		for (int j = 0; j < cNorm.cols; ++j) {
			float response = cNorm.at<float>(i, j);
			if (response <= threshold) continue;
			keyPoint.push_back(KeyPoint(Point(j, i), 3, -1.0F, response));
		}
	}

	ANMS(keyPoint, corners);
}